

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyFormatter.h
# Opt level: O3

void __thiscall
Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
basic_formatter<char_const*>
          (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this,char **sin)

{
  char *__s;
  size_t sVar1;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  __s = *sin;
  if (__s == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  }
  return;
}

Assistant:

basic_formatter(const TT& sin)  {
        underlying << sin;
    }